

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::Init
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          MeshEdgebreakerEncoder *encoder)

{
  bool bVar1;
  int iVar2;
  Mesh *pMVar3;
  EncoderOptions *this_00;
  MeshEncoder *in_RSI;
  long in_RDI;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  DracoOptions<int> *in_stack_ffffffffffffff60;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_31;
  string local_30 [24];
  EncoderOptionsBase<int> *in_stack_ffffffffffffffe8;
  
  *(MeshEncoder **)(in_RDI + 8) = in_RSI;
  pMVar3 = MeshEncoder::mesh(in_RSI);
  *(Mesh **)(in_RDI + 0x10) = pMVar3;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x19e7b2);
  PointCloudEncoder::options(*(PointCloudEncoder **)(in_RDI + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  bVar1 = DracoOptions<int>::IsGlobalOptionSet
                    (in_stack_ffffffffffffff60,
                     (string *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (bVar1) {
    this_00 = PointCloudEncoder::options(*(PointCloudEncoder **)(in_RDI + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar1 = DracoOptions<int>::GetGlobalBool
                      (&this_00->super_DracoOptions<int>,
                       (string *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),false
                      );
    *(bool *)(in_RDI + 0x2c0) = bVar1;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  else {
    PointCloudEncoder::options(*(PointCloudEncoder **)(in_RDI + 8));
    iVar2 = EncoderOptionsBase<int>::GetSpeed(in_stack_ffffffffffffffe8);
    if (iVar2 < 6) {
      *(undefined1 *)(in_RDI + 0x2c0) = 0;
    }
    else {
      *(undefined1 *)(in_RDI + 0x2c0) = 1;
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::Init(
    MeshEdgebreakerEncoder *encoder) {
  encoder_ = encoder;
  mesh_ = encoder->mesh();
  attribute_encoder_to_data_id_map_.clear();

  if (encoder_->options()->IsGlobalOptionSet("split_mesh_on_seams")) {
    use_single_connectivity_ =
        encoder_->options()->GetGlobalBool("split_mesh_on_seams", false);
  } else if (encoder_->options()->GetSpeed() >= 6) {
    // Else use default setting based on speed.
    use_single_connectivity_ = true;
  } else {
    use_single_connectivity_ = false;
  }
  return true;
}